

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O3

void mbedtls_ecp_group_free(mbedtls_ecp_group *grp)

{
  mbedtls_ecp_point *__ptr;
  long lVar1;
  ulong uVar2;
  
  if (grp != (mbedtls_ecp_group *)0x0) {
    if (grp->h != 1) {
      mbedtls_mpi_free(&grp->A);
      mbedtls_mpi_free(&grp->B);
      mbedtls_mpi_free(&(grp->G).X);
      mbedtls_mpi_free(&(grp->G).Y);
      mbedtls_mpi_free(&(grp->G).Z);
      mbedtls_mpi_free(&grp->N);
      mbedtls_mpi_free(&grp->P);
    }
    __ptr = grp->T;
    if (__ptr != (mbedtls_ecp_point *)0x0) {
      if (grp->T_size != 0) {
        lVar1 = 0;
        uVar2 = 0;
        do {
          mbedtls_ecp_point_free((mbedtls_ecp_point *)((long)&(grp->T->X).p + lVar1));
          uVar2 = uVar2 + 1;
          lVar1 = lVar1 + 0x30;
        } while (uVar2 < grp->T_size);
        __ptr = grp->T;
      }
      free(__ptr);
    }
    mbedtls_platform_zeroize(grp,0xc0);
    return;
  }
  return;
}

Assistant:

void mbedtls_ecp_group_free(mbedtls_ecp_group *grp)
{
    size_t i;

    if (grp == NULL) {
        return;
    }

    if (grp->h != 1) {
        mbedtls_mpi_free(&grp->A);
        mbedtls_mpi_free(&grp->B);
        mbedtls_ecp_point_free(&grp->G);

#if !defined(MBEDTLS_ECP_WITH_MPI_UINT)
        mbedtls_mpi_free(&grp->N);
        mbedtls_mpi_free(&grp->P);
#endif
    }

    if (!ecp_group_is_static_comb_table(grp) && grp->T != NULL) {
        for (i = 0; i < grp->T_size; i++) {
            mbedtls_ecp_point_free(&grp->T[i]);
        }
        mbedtls_free(grp->T);
    }

    mbedtls_platform_zeroize(grp, sizeof(mbedtls_ecp_group));
}